

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

StringEnumeration * icu_63::PluralRules::getAvailableLocales(UErrorCode *status)

{
  UBool UVar1;
  PluralAvailableLocalesEnumeration *this;
  size_t in_RSI;
  PluralAvailableLocalesEnumeration *local_48;
  LocalPointerBase<icu_63::StringEnumeration> local_20;
  LocalPointer<icu_63::StringEnumeration> result;
  UErrorCode *status_local;
  
  result.super_LocalPointerBase<icu_63::StringEnumeration>.ptr =
       (LocalPointerBase<icu_63::StringEnumeration>)
       (LocalPointerBase<icu_63::StringEnumeration>)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (PluralAvailableLocalesEnumeration *)UMemory::operator_new((UMemory *)0x88,in_RSI);
    local_48 = (PluralAvailableLocalesEnumeration *)0x0;
    if (this != (PluralAvailableLocalesEnumeration *)0x0) {
      PluralAvailableLocalesEnumeration::PluralAvailableLocalesEnumeration
                (this,(UErrorCode *)result.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
      local_48 = this;
    }
    LocalPointer<icu_63::StringEnumeration>::LocalPointer
              ((LocalPointer<icu_63::StringEnumeration> *)&local_20,
               &local_48->super_StringEnumeration,
               (UErrorCode *)result.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
    UVar1 = ::U_FAILURE(*(UErrorCode *)result.super_LocalPointerBase<icu_63::StringEnumeration>.ptr)
    ;
    if (UVar1 == '\0') {
      status_local = (UErrorCode *)LocalPointerBase<icu_63::StringEnumeration>::orphan(&local_20);
    }
    else {
      status_local = (UErrorCode *)0x0;
    }
    LocalPointer<icu_63::StringEnumeration>::~LocalPointer
              ((LocalPointer<icu_63::StringEnumeration> *)&local_20);
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (StringEnumeration *)status_local;
}

Assistant:

StringEnumeration* PluralRules::getAvailableLocales(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return nullptr;
    }
    LocalPointer<StringEnumeration> result(new PluralAvailableLocalesEnumeration(status), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    return result.orphan();
}